

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  FILE *f;
  double *pdVar2;
  int i;
  long lVar3;
  double dVar4;
  
  if (argc == 2) {
    f = fopen(argv[1],"r");
    if (f == (FILE *)0x0) {
      main_cold_2();
    }
    pdVar2 = cos_cache;
    lVar3 = 0;
    do {
      dVar4 = cos((double)(int)lVar3 * 3.141592653589793 * 0.0625);
      *pdVar2 = dVar4;
      lVar3 = lVar3 + 1;
      pdVar2 = pdVar2 + 1;
    } while (lVar3 != 200);
    readStream((FILE *)f);
    iVar1 = 0;
  }
  else {
    main_cold_1();
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int main(int argc, char *argv[]) {
    if (argc != 2) {
        fprintf(stderr, "用法：jpeg_decoder <jpeg file>\n");
        return 1;
    }
    FILE *f = fopen(argv[1], "r");
    if (f == NULL) {
        fprintf(stderr, "檔案開啟失敗\n");
    }
    init_cos_cache();
    readStream(f);
    return 0;
}